

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O1

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkeyFromWif
          (Privkey *__return_storage_ptr__,KeyApi *this,string *wif,NetType *net_type,
          bool *is_compressed)

{
  pointer puVar1;
  bool bVar2;
  CfdException *this_00;
  bool is_compress;
  NetType temp_net_type;
  bool local_4d;
  NetType local_4c;
  string local_48;
  
  core::Privkey::Privkey(__return_storage_ptr__);
  local_4d = true;
  local_4c = kMainnet;
  bVar2 = core::Privkey::HasWif(wif,&local_4c,&local_4d);
  if (bVar2) {
    core::Privkey::FromWif((Privkey *)&local_48,wif,local_4c,local_4d);
    puVar1 = (__return_storage_ptr__->data_).data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_48._M_dataplus._M_p;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_48._M_string_length;
    (__return_storage_ptr__->data_).data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_48.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    __return_storage_ptr__->is_compressed_ = (bool)local_48.field_2._8_1_;
    *(undefined3 *)&__return_storage_ptr__->field_0x19 = local_48.field_2._9_3_;
    __return_storage_ptr__->net_type_ = local_48.field_2._12_4_;
    if ((pointer)local_48._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (net_type != (NetType *)0x0) {
      *net_type = local_4c;
    }
    if (is_compressed != (bool *)0x0) {
      *is_compressed = local_4d;
    }
  }
  bVar2 = core::Privkey::IsValid(__return_storage_ptr__);
  if (bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Failed to GetPrivkeyFromWif. Wif format error.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Privkey KeyApi::GetPrivkeyFromWif(
    const std::string& wif, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(wif, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(wif, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  }

  if (!key.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to GetPrivkeyFromWif. Wif format error.");
  }
  return key;
}